

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtp-rb.c
# Opt level: O3

void rtp_rb_print_rb(void)

{
  rtp_pkt_t *prVar1;
  uint uVar2;
  uint uVar3;
  
  prVar1 = rtp_rb;
  uVar2 = rtp_rb_start;
  uVar3 = rtp_rb_end;
  if (rtp_rb_start != rtp_rb_end) {
    do {
      if (prVar1[uVar2].length != 0) {
        fprintf(_stderr,"%.3u: seq %.3u\n",(ulong)uVar2,(ulong)*(ushort *)&prVar1[uVar2].b.field_0x2
               );
        prVar1 = rtp_rb;
        uVar3 = rtp_rb_end;
      }
      uVar2 = (uVar2 + 1) % rtp_rb_size;
    } while (uVar2 != uVar3);
  }
  return;
}

Assistant:

void rtp_rb_print_rb(void) {
  unsigned int i;
  for (i = rtp_rb_start; i != rtp_rb_end; i = (i + 1) % rtp_rb_size) {
    if (rtp_rb[i].length != 0)
      fprintf(stderr, "%.3u: seq %.3u\n", i, rtp_rb[i].b.seq);
  }
}